

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstddht.cc
# Opt level: O0

int bdStdLoadNodeId(bdNodeId *id,string *input)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  char local_34;
  char local_33;
  int local_30;
  uint8_t value2;
  uint8_t value1;
  char ch2;
  char ch1;
  int i;
  uint32_t reqlen;
  uint8_t *a_data;
  string *input_local;
  bdNodeId *id_local;
  
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 0x28) {
    id_local._4_4_ = 0;
  }
  else {
    for (local_30 = 0; local_30 < 0x14; local_30 = local_30 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar2 = *pcVar4;
      local_33 = '\0';
      local_34 = '\0';
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 < 'A') || ('F' < cVar1)) {
          if (('`' < cVar1) && (cVar1 < 'g')) {
            local_33 = cVar1 + -0x57;
          }
        }
        else {
          local_33 = cVar1 + -0x37;
        }
      }
      else {
        local_33 = cVar1 + -0x30;
      }
      if ((cVar2 < '0') || ('9' < cVar2)) {
        if ((cVar2 < 'A') || ('F' < cVar2)) {
          if (('`' < cVar2) && (cVar2 < 'g')) {
            local_34 = cVar2 + -0x57;
          }
        }
        else {
          local_34 = cVar2 + -0x37;
        }
      }
      else {
        local_34 = cVar2 + -0x30;
      }
      id->data[local_30] = local_33 * '\x10' + local_34;
    }
    id_local._4_4_ = 1;
  }
  return id_local._4_4_;
}

Assistant:

int  bdStdLoadNodeId(bdNodeId *id, std::string input) {
	uint8_t *a_data = (uint8_t *) id->data;
	uint32_t reqlen = BITDHT_KEY_LEN * 2;
	if (input.size() < reqlen)
		return 0;

	for (int i = 0; i < BITDHT_KEY_LEN; i++)	{
		char ch1 = input[2 * i];
		char ch2 = input[2 * i + 1];
		uint8_t value1 = 0;
		uint8_t value2 = 0;

		/* do char1 */
        	if (ch1 >= '0' && ch1 <= '9')
            		value1 = (ch1 - '0');
        	else if (ch1 >= 'A' && ch1 <= 'F')
            		value1 = (ch1 - 'A' + 10);
        	else if (ch1 >= 'a' && ch1 <= 'f')
            		value1 = (ch1 - 'a' + 10);

		/* do char2 */
        	if (ch2 >= '0' && ch2 <= '9')
            		value2 = (ch2 - '0');
        	else if (ch2 >= 'A' && ch2 <= 'F')
            		value2 = (ch2 - 'A' + 10);
        	else if (ch2 >= 'a' && ch2 <= 'f')
            		value2 = (ch2 - 'a' + 10);

		a_data[i] = (value1 << 4) + value2;
	}
	return 1;
}